

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsViewPrivate::mouseMoveEventHandler(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *pQVar1;
  QGraphicsView *this_00;
  Data *pDVar2;
  QGraphicsItem **ppQVar3;
  long lVar4;
  QGraphicsItem *this_01;
  bool bVar5;
  MouseEventSource source;
  MouseEventFlags flags;
  QFlagsStorage<Qt::MouseButton> QVar6;
  QPoint QVar7;
  QWidget *widget;
  QObject *pQVar8;
  long lVar9;
  QGraphicsScenePrivate *this_02;
  long in_FS_OFFSET;
  QPointF QVar10;
  QArrayDataPointer<QGraphicsItem_*> local_88;
  QPointF local_70;
  QPoint local_60;
  undefined1 local_58 [12];
  char cStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  updateRubberBand(this,event);
  storeMouseEvent(this,event);
  pQVar1 = &this->lastMouseEvent;
  (**(code **)(*(long *)&(this->lastMouseEvent).field_0 + 0x10))(pQVar1,0);
  if ((*(uint *)&this->field_0x300 & 0x201) != 1) goto LAB_005b9cc7;
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this->scene);
  if (!bVar5) goto LAB_005b9cc7;
  local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
            ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMouseMove);
  QGraphicsSceneEvent::setWidget
            ((QGraphicsSceneEvent *)local_58,(this->super_QAbstractScrollAreaPrivate).viewport);
  QGraphicsSceneMouseEvent::setButtonDownScenePos
            ((QGraphicsSceneMouseEvent *)local_58,this->mousePressButton,&this->mousePressScenePoint
            );
  QGraphicsSceneMouseEvent::setButtonDownScreenPos
            ((QGraphicsSceneMouseEvent *)local_58,this->mousePressButton,
             &this->mousePressScreenPoint);
  QVar10 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_70.yp = QVar10.yp;
  local_70.xp = QVar10.xp;
  local_60 = QPointF::toPoint(&local_70);
  QVar10 = QGraphicsView::mapToScene(this_00,&local_60);
  local_88.ptr = (QGraphicsItem **)QVar10.yp;
  local_88.d = (Data *)QVar10.xp;
  QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_58,(QPointF *)&local_88);
  QVar10 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  local_88.ptr = (QGraphicsItem **)QVar10.yp;
  local_88.d = (Data *)QVar10.xp;
  local_70.xp = (qreal)QPointF::toPoint((QPointF *)&local_88);
  QGraphicsSceneMouseEvent::setScreenPos((QGraphicsSceneMouseEvent *)local_58,(QPoint *)&local_70);
  QGraphicsSceneMouseEvent::setLastScenePos
            ((QGraphicsSceneMouseEvent *)local_58,&this->lastMouseMoveScenePoint);
  QGraphicsSceneMouseEvent::setLastScreenPos
            ((QGraphicsSceneMouseEvent *)local_58,&this->lastMouseMoveScreenPoint);
  QGraphicsSceneMouseEvent::setButtons
            ((QGraphicsSceneMouseEvent *)local_58,
             (QFlagsStorageHelper<Qt::MouseButton,_4>)
             *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
  QGraphicsSceneMouseEvent::setButton
            ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
  QGraphicsSceneMouseEvent::setModifiers
            ((QGraphicsSceneMouseEvent *)local_58,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
             *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
  source = QMouseEvent::source();
  QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
  flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i =
       (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
  QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
  QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
  QVar10 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)local_58);
  (this->lastMouseMoveScenePoint).xp = QVar10.xp;
  (this->lastMouseMoveScenePoint).yp = QVar10.yp;
  QVar7 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)local_58);
  this->lastMouseMoveScreenPoint = QVar7;
  cStack_4c = 0;
  pDVar2 = (this->scene).wp.d;
  if (event[0xb] == (QMouseEvent)0x1) {
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar8 = (QObject *)0x0;
    }
    else {
      pQVar8 = (this->scene).wp.value;
    }
    qt_sendSpontaneousEvent(pQVar8,(QEvent *)local_58);
  }
  else {
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar8 = (QObject *)0x0;
    }
    else {
      pQVar8 = (this->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar8,(QEvent *)local_58);
  }
  (**(code **)(*(long *)&pQVar1->field_0 + 0x10))(pQVar1,cStack_4c);
  if (cStack_4c == '\x01') {
    QVar6.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)local_58);
    if ((QFlagsStorage<Qt::MouseButton>)QVar6.i == (QFlagsStorage<Qt::MouseButton>)0x0)
    goto LAB_005b9b64;
  }
  else {
LAB_005b9b64:
    this_02 = *(QGraphicsScenePrivate **)((this->scene).wp.value + 8);
    if ((((*(uint *)&this_02->field_0xb8 >> 0xc & 1) != 0) &&
        ((*(uint *)&this_02->field_0xb8 >> 0xd & 1) == 0)) &&
       ((this_02->cachedItemsUnderMouse).d.size == 0)) {
      local_60 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)local_58);
      QVar10 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)local_58);
      local_70.yp = QVar10.yp;
      local_70.xp = QVar10.xp;
      widget = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)local_58);
      QGraphicsScenePrivate::itemsAtPosition
                ((QList<QGraphicsItem_*> *)&local_88,this_02,&local_60,&local_70,widget);
      QArrayDataPointer<QGraphicsItem_*>::operator=
                ((QArrayDataPointer<QGraphicsItem_*> *)
                 (*(long *)((this->scene).wp.value + 8) + 0x228),&local_88);
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_88);
      this_02 = *(QGraphicsScenePrivate **)((this->scene).wp.value + 8);
    }
    ppQVar3 = (this_02->cachedItemsUnderMouse).d.ptr;
    lVar4 = (this_02->cachedItemsUnderMouse).d.size;
    for (lVar9 = 0; lVar4 << 3 != lVar9; lVar9 = lVar9 + 8) {
      this_01 = *(QGraphicsItem **)((long)ppQVar3 + lVar9);
      bVar5 = QGraphicsItem::isEnabled(this_01);
      if (bVar5) {
        bVar5 = QGraphicsItem::hasCursor(this_01);
        if (bVar5) {
          QGraphicsItem::cursor((QGraphicsItem *)&local_88);
          _q_setViewportCursor(this,(QCursor *)&local_88);
          QCursor::~QCursor((QCursor *)&local_88);
          goto LAB_005b9cbd;
        }
      }
    }
    if (this->hasStoredOriginalCursor == true) {
      this->hasStoredOriginalCursor = false;
      QWidget::setCursor((this->super_QAbstractScrollAreaPrivate).viewport,&this->originalCursor);
    }
  }
LAB_005b9cbd:
  QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
LAB_005b9cc7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::mouseMoveEventHandler(QMouseEvent *event)
{
    Q_Q(QGraphicsView);

#if QT_CONFIG(rubberband)
    updateRubberBand(event);
#endif

    storeMouseEvent(event);
    lastMouseEvent->setAccepted(false);

    if (!sceneInteractionAllowed)
        return;
    if (handScrolling)
        return;
    if (!scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseMove);
    mouseEvent.setWidget(viewport);
    mouseEvent.setButtonDownScenePos(mousePressButton, mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(mousePressButton, mousePressScreenPoint);
    mouseEvent.setScenePos(q->mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    lastMouseMoveScenePoint = mouseEvent.scenePos();
    lastMouseMoveScreenPoint = mouseEvent.screenPos();
    mouseEvent.setAccepted(false);
    if (event->spontaneous())
        qt_sendSpontaneousEvent(scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(scene, &mouseEvent);

    // Remember whether the last event was accepted or not.
    lastMouseEvent->setAccepted(mouseEvent.isAccepted());

    if (mouseEvent.isAccepted() && mouseEvent.buttons() != 0) {
        // The event was delivered to a mouse grabber; the press is likely to
        // have set a cursor, and we must not change it.
        return;
    }

#ifndef QT_NO_CURSOR
    // If all the items ignore hover events, we don't look-up any items
    // in QGraphicsScenePrivate::dispatchHoverEvent, hence the
    // cachedItemsUnderMouse list will be empty. We therefore do the look-up
    // for cursor items here if not all items use the default cursor.
    if (scene->d_func()->allItemsIgnoreHoverEvents && !scene->d_func()->allItemsUseDefaultCursor
        && scene->d_func()->cachedItemsUnderMouse.isEmpty()) {
        scene->d_func()->cachedItemsUnderMouse = scene->d_func()->itemsAtPosition(mouseEvent.screenPos(),
                                                                                  mouseEvent.scenePos(),
                                                                                  mouseEvent.widget());
    }
    // Find the topmost item under the mouse with a cursor.
    for (QGraphicsItem *item : std::as_const(scene->d_func()->cachedItemsUnderMouse)) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // No items with cursors found; revert to the view cursor.
    if (hasStoredOriginalCursor) {
        // Restore the original viewport cursor.
        hasStoredOriginalCursor = false;
        viewport->setCursor(originalCursor);
    }
#endif
}